

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O0

bool __thiscall
wasm::CodeFolding::optimizeTerminatingTails
          (CodeFolding *this,
          vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *tails,Index num
          )

{
  anon_class_8_1_b991b068 *paVar1;
  anon_class_24_3_7c37a384_for__M_pred __pred;
  anon_class_32_4_ee1ba314_for__M_pred __pred_00;
  Name name;
  anon_class_16_2_f95a33aa_for__M_pred __pred_01;
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *pvVar2;
  bool bVar3;
  size_type sVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  Module *wasm;
  Function *pFVar8;
  ulong uVar9;
  Break *pBVar10;
  ExpressionList *pEVar11;
  Return *pRVar12;
  Block *pBVar13;
  reference ppEVar14;
  Type type_;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar15;
  Name NVar16;
  Block *outer;
  Block *local_4e8;
  Block *toplevel;
  Block *local_4d8;
  Block *inner;
  Expression *old;
  size_t sStack_4c0;
  uintptr_t local_4b0;
  Expression *local_4a8;
  size_t sStack_4a0;
  uint local_494;
  reference pTStack_490;
  Index i;
  Tail *tail_2;
  iterator __end2;
  iterator __begin2;
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *__range2;
  string local_468;
  undefined1 auStack_448 [8];
  Name innerName;
  LabelManager labels;
  Builder builder;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> mergeable;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  local_2f8;
  const_iterator local_2f0;
  anon_class_8_1_7edb1669 *local_2e8;
  Index *pIStack_2e0;
  pointer *local_2d8;
  Tail *local_2d0;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  local_2c8;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  local_2c0;
  const_iterator local_2b8;
  undefined1 local_2b0 [8];
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> explore;
  Expression *correct;
  __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  local_288;
  const_iterator local_280;
  pointer *local_278;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *local_270;
  Expression **local_268;
  __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  local_260;
  __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  local_258;
  const_iterator local_250;
  undefined1 local_248 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> others;
  value_type first;
  mapped_type *items;
  mapped_type local_200;
  mapped_type digest;
  Expression *item_1;
  Tail *tail_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *__range3_1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> seen;
  mapped_type hash;
  Expression *item;
  Tail *tail;
  iterator __end3;
  iterator __begin3;
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *__range3;
  map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
  hashed;
  map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
  hashes;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  local_108;
  const_iterator local_100;
  anon_class_8_1_b991b068 *local_e8;
  Index *pIStack_e0;
  CodeFolding *local_d8;
  CodeFolding *pCStack_d0;
  Tail *local_c8;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  local_c0;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  local_b8;
  const_iterator local_b0;
  undefined1 local_a8 [8];
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> next;
  anon_class_16_2_c54e8edd worthIt;
  anon_class_8_1_7edb1669 getTailItems;
  anon_class_8_1_b991b068 getItem;
  anon_class_1_0_00000001 effectiveSize;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_58;
  Tail *local_48;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  local_40;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  local_38;
  const_iterator local_30;
  Index local_24;
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *pvStack_20;
  Index num_local;
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *tails_local;
  CodeFolding *this_local;
  
  local_24 = num;
  pvStack_20 = tails;
  tails_local = (vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)this;
  sVar4 = std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::size
                    (tails);
  pvVar2 = pvStack_20;
  if (sVar4 < 2) {
    this_local._7_1_ = 0;
    goto LAB_015e3e13;
  }
  local_40._M_current =
       (Tail *)std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::begin
                         (pvStack_20);
  local_48 = (Tail *)std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                     ::end(pvStack_20);
  local_58._8_8_ = this;
  local_38 = std::
             remove_if<__gnu_cxx::__normal_iterator<wasm::CodeFolding::Tail*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>,wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::CodeFolding::Tail&)_1_>
                       (local_40,(__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                                  )local_48,(anon_class_8_1_8991fb9c_for__M_pred)this);
  __gnu_cxx::
  __normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
  ::__normal_iterator<wasm::CodeFolding::Tail*>
            ((__normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
              *)&local_30,&local_38);
  local_60._M_current =
       (Tail *)std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::end
                         (pvStack_20);
  __gnu_cxx::
  __normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
  ::__normal_iterator<wasm::CodeFolding::Tail*>
            ((__normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
              *)local_58._M_local_buf,&local_60);
  std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::erase
            (pvVar2,local_30,(const_iterator)local_58._M_allocated_capacity);
  paVar1 = (anon_class_8_1_b991b068 *)((long)&getItem.effectiveSize + 7);
  next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)&worthIt.this;
  worthIt.getTailItems = (anon_class_8_1_7edb1669 *)this;
  worthIt.this = (CodeFolding *)&getTailItems;
  getTailItems.getItem = paVar1;
  std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::vector
            ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)local_a8,
             pvStack_20);
  local_c0._M_current =
       (Tail *)std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::begin
                         ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                           *)local_a8);
  local_c8 = (Tail *)std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                     ::end((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                            *)local_a8);
  pIStack_e0 = &local_24;
  __pred_00.num = pIStack_e0;
  __pred_00.effectiveSize = (anon_class_1_0_00000001 *)paVar1;
  __pred_00.getItem = (anon_class_8_1_b991b068 *)&getTailItems;
  __pred_00.this = this;
  local_e8 = paVar1;
  local_d8 = (CodeFolding *)&getTailItems;
  pCStack_d0 = this;
  local_b8 = std::
             remove_if<__gnu_cxx::__normal_iterator<wasm::CodeFolding::Tail*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>,wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::CodeFolding::Tail&)_3_>
                       (local_c0,(__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                                  )local_c8,__pred_00);
  __gnu_cxx::
  __normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
  ::__normal_iterator<wasm::CodeFolding::Tail*>
            ((__normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
              *)&local_b0,&local_b8);
  local_108._M_current =
       (Tail *)std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::end
                         ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                           *)local_a8);
  __gnu_cxx::
  __normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
  ::__normal_iterator<wasm::CodeFolding::Tail*>
            ((__normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
              *)&local_100,&local_108);
  std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::erase
            ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)local_a8,
             local_b0,local_100);
  sVar4 = std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::size
                    ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                     local_a8);
  if (sVar4 < 2) {
LAB_015e36df:
    if (local_24 == 0) {
      this_local._7_1_ = 0;
    }
    else {
      bVar3 = optimizeTerminatingTails::anon_class_16_2_c54e8edd::operator()
                        ((anon_class_16_2_c54e8edd *)
                         &next.
                          super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,local_24,pvStack_20);
      if (bVar3) {
        optimizeTerminatingTails::anon_class_8_1_7edb1669::operator()
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                   (anon_class_8_1_7edb1669 *)&worthIt.this,local_24,pvStack_20);
        this->anotherPass = true;
        wasm = Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>::getModule
                         ((Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_> *)
                          &(this->
                           super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                           ).
                           super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                         );
        Builder::Builder((Builder *)&labels.counter,wasm);
        pFVar8 = Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>::getFunction
                           ((Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_> *)
                            &(this->
                             super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                             ).
                             super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                           );
        LabelUtils::LabelManager::LabelManager
                  ((LabelManager *)&innerName.super_IString.str._M_str,pFVar8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"folding-inner",(allocator<char> *)((long)&__range2 + 7));
        NVar16 = LabelUtils::LabelManager::getUnique
                           ((LabelManager *)&innerName.super_IString.str._M_str,&local_468);
        innerName.super_IString.str._M_len = NVar16.super_IString.str._M_str;
        auStack_448 = NVar16.super_IString.str._M_len;
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
        pvVar2 = pvStack_20;
        __end2 = std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
                 begin(pvStack_20);
        tail_2 = (Tail *)std::
                         vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
                         end(pvVar2);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                                           *)&tail_2), bVar3) {
          pTStack_490 = __gnu_cxx::
                        __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                        ::operator*(&__end2);
          if (pTStack_490->block == (Block *)0x0) {
            markAsModified(this,pTStack_490->expr);
            old = (Expression *)auStack_448;
            sStack_4c0 = innerName.super_IString.str._M_len;
            NVar16.super_IString.str._M_str = (char *)innerName.super_IString.str._M_len;
            NVar16.super_IString.str._M_len = (size_t)auStack_448;
            pBVar10 = Builder::makeBreak((Builder *)&labels.counter,NVar16,(Expression *)0x0,
                                         (Expression *)0x0);
            *pTStack_490->pointer = (Expression *)pBVar10;
          }
          else {
            markAsModified(this,(Expression *)pTStack_490->block);
            for (local_494 = 0; uVar9 = (ulong)local_494,
                sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)&builder), uVar9 < sVar4; local_494 = local_494 + 1) {
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::pop_back
                        (&(pTStack_490->block->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
            }
            pBVar13 = pTStack_490->block;
            local_4a8 = (Expression *)auStack_448;
            sStack_4a0 = innerName.super_IString.str._M_len;
            name.super_IString.str._M_str = (char *)innerName.super_IString.str._M_len;
            name.super_IString.str._M_len = (size_t)auStack_448;
            pBVar10 = Builder::makeBreak((Builder *)&labels.counter,name,(Expression *)0x0,
                                         (Expression *)0x0);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (&(pBVar13->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       (Expression *)pBVar10);
            local_4b0 = (pTStack_490->block->super_SpecificExpression<(wasm::Expression::Id)1>).
                        super_Expression.type.id;
            Block::finalize(pTStack_490->block,(Type)local_4b0);
          }
          __gnu_cxx::
          __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
          ::operator++(&__end2);
        }
        pFVar8 = Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>::getFunction
                           ((Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_> *)
                            &(this->
                             super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                             ).
                             super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                           );
        inner = (Block *)pFVar8->body;
        local_4d8 = Builder::makeBlock((Builder *)&labels.counter,(Expression *)0x0);
        wasm::Name::operator=(&local_4d8->name,(Name *)auStack_448);
        toplevel._4_4_ = 1;
        bVar3 = wasm::Type::operator==
                          (&(inner->super_SpecificExpression<(wasm::Expression::Id)1>).
                            super_Expression.type,(BasicType *)((long)&toplevel + 4));
        if (bVar3) {
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(local_4d8->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)inner);
        }
        else {
          toplevel._0_4_ = 0;
          bVar3 = wasm::Type::operator==
                            (&(inner->super_SpecificExpression<(wasm::Expression::Id)1>).
                              super_Expression.type,(BasicType *)&toplevel);
          if (bVar3) {
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (&(local_4d8->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       (Expression *)inner);
            pEVar11 = &local_4d8->list;
            pRVar12 = Builder::makeReturn((Builder *)&labels.counter,(Expression *)0x0);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (&pEVar11->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       (Expression *)pRVar12);
          }
          else {
            local_4e8 = Expression::dynCast<wasm::Block>((Expression *)inner);
            if (local_4e8 != (Block *)0x0) {
              Block::finalize(local_4e8);
            }
            outer._4_4_ = 1;
            bVar3 = wasm::Type::operator!=
                              (&(inner->super_SpecificExpression<(wasm::Expression::Id)1>).
                                super_Expression.type,(BasicType *)((long)&outer + 4));
            if (bVar3) {
              pEVar11 = &local_4d8->list;
              pRVar12 = Builder::makeReturn((Builder *)&labels.counter,(Expression *)inner);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&pEVar11->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(Expression *)pRVar12);
            }
            else {
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&(local_4d8->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(Expression *)inner);
            }
          }
        }
        Block::finalize(local_4d8);
        pBVar13 = Builder::makeBlock((Builder *)&labels.counter,(Expression *)0x0);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBVar13->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)local_4d8);
        while (bVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                                 ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *
                                  )&builder), ((bVar3 ^ 0xffU) & 1) != 0) {
          ppEVar14 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::back
                               ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                &builder);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(pBVar13->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     *ppEVar14);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
        }
        pFVar8 = Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>::getFunction
                           ((Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_> *)
                            &(this->
                             super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                             ).
                             super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                           );
        type_ = Function::getResults(pFVar8);
        Block::finalize(pBVar13,type_);
        pFVar8 = Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>::getFunction
                           ((Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_> *)
                            &(this->
                             super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                             ).
                             super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                           );
        pFVar8->body = (Expression *)pBVar13;
        this_local._7_1_ = 1;
        LabelUtils::LabelManager::~LabelManager((LabelManager *)&innerName.super_IString.str._M_str)
        ;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    std::
    map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
    ::map((map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
           *)&hashed._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ::map((map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
           *)&__range3);
    __end3 = std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::begin
                       ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *
                        )local_a8);
    tail = (Tail *)std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
                   end((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                       local_a8);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                                       *)&tail), bVar3) {
      item = (Expression *)
             __gnu_cxx::
             __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
             ::operator*(&__end3);
      hash = (mapped_type)
             optimizeTerminatingTails::anon_class_8_1_b991b068::operator()
                       ((anon_class_8_1_b991b068 *)&getTailItems,(Tail *)item,local_24);
      sVar5 = ExpressionAnalyzer::hash((Expression *)hash);
      pmVar6 = std::
               map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
               ::operator[]((map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                             *)&hashed._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)&hash);
      *pmVar6 = sVar5;
      seen._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar5;
      pmVar7 = std::
               map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
               ::operator[]((map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                             *)&__range3,&seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pmVar7,(value_type *)&hash);
      __gnu_cxx::
      __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
      ::operator++(&__end3);
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &__range3_1);
    __end3_1 = std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::begin
                         ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                           *)local_a8);
    tail_1 = (Tail *)std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                     ::end((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                            *)local_a8);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                               *)&tail_1), bVar3) {
      item_1 = (Expression *)
               __gnu_cxx::
               __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
               ::operator*(&__end3_1);
      digest = (mapped_type)
               optimizeTerminatingTails::anon_class_8_1_b991b068::operator()
                         ((anon_class_8_1_b991b068 *)&getTailItems,(Tail *)item_1,local_24);
      pmVar6 = std::
               map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
               ::operator[]((map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                             *)&hashed._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)&digest);
      local_200 = *pmVar6;
      pVar15 = std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
               emplace<unsigned_long&>
                         ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>
                           *)&__range3_1,&local_200);
      if (((pVar15.second ^ 0xffU) & 1) == 0) {
        pmVar7 = std::
                 map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                 ::operator[]((map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                               *)&__range3,&local_200);
        sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size(pmVar7);
        if (sVar4 != 1) {
          sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size(pmVar7)
          ;
          if (sVar4 == 0) {
            __assert_fail("items.size() > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodeFolding.cpp"
                          ,0x276,
                          "bool wasm::CodeFolding::optimizeTerminatingTails(std::vector<Tail> &, Index)"
                         );
          }
          while (sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                                   (pmVar7), 1 < sVar4) {
            ppEVar14 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                       operator[](pmVar7,0);
            others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppEVar14;
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_248)
            ;
            local_260._M_current =
                 (Expression **)
                 std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin(pmVar7)
            ;
            local_268 = (Expression **)
                        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                                  (pmVar7);
            local_278 = &others.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __pred_01.others =
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_248;
            __pred_01.first = (value_type *)local_278;
            local_270 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_248
            ;
            local_258 = std::
                        remove_if<__gnu_cxx::__normal_iterator<wasm::Expression**,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>,wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::Expression*)_1_>
                                  (local_260,
                                   (__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                    )local_268,__pred_01);
            __gnu_cxx::
            __normal_iterator<wasm::Expression*const*,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ::__normal_iterator<wasm::Expression**>
                      ((__normal_iterator<wasm::Expression*const*,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                        *)&local_250,&local_258);
            local_288._M_current =
                 (Expression **)
                 std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end(pmVar7);
            __gnu_cxx::
            __normal_iterator<wasm::Expression*const*,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ::__normal_iterator<wasm::Expression**>
                      ((__normal_iterator<wasm::Expression*const*,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                        *)&local_280,&local_288);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::erase
                      (pmVar7,local_250,local_280);
            sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                              (pmVar7);
            if (sVar4 < 2) {
LAB_015e361b:
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::swap
                        (pmVar7,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                local_248);
              bVar3 = false;
            }
            else {
              ppEVar14 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                         operator[](pmVar7,0);
              explore.
              super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppEVar14;
              std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::vector
                        ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                          *)local_2b0,
                         (vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                          *)local_a8);
              local_2c8._M_current =
                   (Tail *)std::
                           vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                           ::begin((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                    *)local_2b0);
              local_2d0 = (Tail *)std::
                                  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                  ::end((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                         *)local_2b0);
              local_2e8 = &getTailItems;
              pIStack_2e0 = &local_24;
              local_2d8 = &explore.
                           super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              __pred.num = pIStack_2e0;
              __pred.getItem = (anon_class_8_1_b991b068 *)local_2e8;
              __pred.correct = (Expression **)local_2d8;
              local_2c0 = std::
                          remove_if<__gnu_cxx::__normal_iterator<wasm::CodeFolding::Tail*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>,wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::CodeFolding::Tail&)_4_>
                                    (local_2c8,
                                     (__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                                      )local_2d0,__pred);
              __gnu_cxx::
              __normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
              ::__normal_iterator<wasm::CodeFolding::Tail*>
                        ((__normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
                          *)&local_2b8,&local_2c0);
              local_2f8._M_current =
                   (Tail *)std::
                           vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                           ::end((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                  *)local_2b0);
              __gnu_cxx::
              __normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
              ::__normal_iterator<wasm::CodeFolding::Tail*>
                        ((__normal_iterator<wasm::CodeFolding::Tail_const*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>
                          *)&local_2f0,&local_2f8);
              std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::erase
                        ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                          *)local_2b0,local_2b8,local_2f0);
              bVar3 = optimizeTerminatingTails
                                (this,(vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                       *)local_2b0,local_24 + 1);
              if (bVar3) {
                this_local._7_1_ = 1;
              }
              std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
              ~vector((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                      local_2b0);
              if (!bVar3) goto LAB_015e361b;
            }
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_248)
            ;
            if (bVar3 != false) goto LAB_015e3680;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
      ::operator++(&__end3_1);
    }
    bVar3 = false;
LAB_015e3680:
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &__range3_1);
    std::
    map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ::~map((map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
            *)&__range3);
    std::
    map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
    ::~map((map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
            *)&hashed._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar3 == false) goto LAB_015e36df;
  }
  std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::~vector
            ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)local_a8);
LAB_015e3e13:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool optimizeTerminatingTails(std::vector<Tail>& tails, Index num = 0) {
    if (tails.size() < 2) {
      return false;
    }
    // remove things that are untoward and cannot be optimized
    tails.erase(
      std::remove_if(tails.begin(),
                     tails.end(),
                     [&](Tail& tail) {
                       if (tail.expr && modifieds.count(tail.expr) > 0) {
                         return true;
                       }
                       if (tail.block && modifieds.count(tail.block) > 0) {
                         return true;
                       }
                       // if we were not modified, then we should be valid for
                       // processing
                       tail.validate();
                       return false;
                     }),
      tails.end());
    // now let's try to find subsets that are mergeable. we don't look hard
    // for the most optimal; further passes may find more
    // effectiveSize: TODO: special-case fallthrough, matters for returns
    auto effectiveSize = [&](Tail& tail) -> Index {
      if (tail.block) {
        return tail.block->list.size();
      } else {
        return 1;
      }
    };
    // getItem: returns the relevant item from the tail. this includes the
    //          final item
    //          TODO: special-case fallthrough, matters for returns
    auto getItem = [&](Tail& tail, Index num) {
      if (tail.block) {
        return tail.block->list[effectiveSize(tail) - num - 1];
      } else {
        return tail.expr;
      }
    };
    // gets the tail elements of a certain depth
    auto getTailItems = [&](Index num, std::vector<Tail>& tails) {
      std::vector<Expression*> items;
      for (Index i = 0; i < num; i++) {
        auto item = getItem(tails[0], i);
        items.push_back(item);
      }
      return items;
    };
    // estimate if a merging is worth the cost
    auto worthIt = [&](Index num, std::vector<Tail>& tails) {
      auto items = getTailItems(num, tails); // the elements we can merge
      Index saved = 0;                       // how much we can save
      for (auto* item : items) {
        saved += Measurer::measure(item) * (tails.size() - 1);
      }
      // compure the cost: in non-fallthroughs, we are replacing the final
      // element with a br; for a fallthrough, if there is one, we must
      // add a return element (for the function body, so it doesn't reach us)
      // TODO: handle fallthroughts for return
      Index cost = tails.size();
      // we also need to add two blocks: for us to break to, and to contain
      // that block and the merged code. very possibly one of the blocks
      // can be removed, though
      cost += WORTH_ADDING_BLOCK_TO_REMOVE_THIS_MUCH;
      // if we cannot merge to the end, then we definitely need 2 blocks,
      // and a branch
      // TODO: efficiency, entire body
      if (!canMove(items, getFunction()->body)) {
        cost += 1 + WORTH_ADDING_BLOCK_TO_REMOVE_THIS_MUCH;
        // TODO: to do this, we need to maintain a map of element=>parent,
        //       so that we can insert the new blocks in the right place
        //       for now, just don't do this optimization
        return false;
      }
      // is it worth it?
      return saved > cost;
    };
    // let's see if we can merge deeper than num, to num + 1
    auto next = tails;
    // remove tails that are too short, or that we hit an item we can't handle
    next.erase(std::remove_if(next.begin(),
                              next.end(),
                              [&](Tail& tail) {
                                if (effectiveSize(tail) < num + 1) {
                                  return true;
                                }
                                auto* newItem = getItem(tail, num);
                                // ignore tails that break to outside blocks. we
                                // want to move code to the very outermost
                                // position, so such code cannot be moved
                                // TODO: this should not be a problem in
                                //       *non*-terminating tails, but
                                //       double-verify that
                                if (EffectAnalyzer(
                                      getPassOptions(), *getModule(), newItem)
                                      .hasExternalBreakTargets()) {
                                  return true;
                                }
                                return false;
                              }),
               next.end());
    // if we have enough to investigate, do so
    if (next.size() >= 2) {
      // now we want to find a mergeable item - any item that is equal among a
      // subset
      std::map<Expression*, size_t> hashes; // expression => hash value
      // hash value => expressions with that hash
      std::map<size_t, std::vector<Expression*>> hashed;
      for (auto& tail : next) {
        auto* item = getItem(tail, num);
        auto hash = hashes[item] = ExpressionAnalyzer::hash(item);
        hashed[hash].push_back(item);
      }
      // look at each hash value exactly once. we do this in a deterministic
      // order by iterating over a vector retaining insertion order.
      std::set<size_t> seen;
      for (auto& tail : next) {
        auto* item = getItem(tail, num);
        auto digest = hashes[item];
        if (!seen.emplace(digest).second) {
          continue;
        }

        auto& items = hashed[digest];
        if (items.size() == 1) {
          continue;
        }
        assert(items.size() > 0);
        // look for an item that has another match.
        while (items.size() >= 2) {
          auto first = items[0];
          std::vector<Expression*> others;
          items.erase(
            std::remove_if(items.begin(),
                           items.end(),
                           [&](Expression* item) {
                             if (item ==
                                   first || // don't bother comparing the first
                                 ExpressionAnalyzer::equal(item, first)) {
                               // equal, keep it
                               return false;
                             } else {
                               // unequal, look at it later
                               others.push_back(item);
                               return true;
                             }
                           }),
            items.end());
          if (items.size() >= 2) {
            // possible merge here, investigate it
            auto* correct = items[0];
            auto explore = next;
            explore.erase(std::remove_if(explore.begin(),
                                         explore.end(),
                                         [&](Tail& tail) {
                                           auto* item = getItem(tail, num);
                                           return !ExpressionAnalyzer::equal(
                                             item, correct);
                                         }),
                          explore.end());
            // try to optimize this deeper tail. if we succeed, then stop here,
            // as the changes may influence us. we leave further opts to further
            // passes (as this is rare in practice, it's generally not a perf
            // issue, but TODO optimize)
            if (optimizeTerminatingTails(explore, num + 1)) {
              return true;
            }
          }
          items.swap(others);
        }
      }
    }
    // we explored deeper (higher num) options, but perhaps there
    // was nothing there while there is something we can do at this level
    // but if we are at num == 0, then we found nothing at all
    if (num == 0) {
      return false;
    }
    // if not worth it, stop
    if (!worthIt(num, tails)) {
      return false;
    }
    // this is worth doing, do it!
    auto mergeable = getTailItems(num, tails); // the elements we can merge
    // since we managed a merge, then it might open up more opportunities later
    anotherPass = true;
    Builder builder(*getModule());
    // TODO: don't create one per merge, linear in function size
    LabelUtils::LabelManager labels(getFunction());
    Name innerName = labels.getUnique("folding-inner");
    for (auto& tail : tails) {
      // remove the items we are merging / moving, and add a break
      // also mark as modified, so we don't try to handle them
      // again in this pass, which might be buggy
      if (tail.block) {
        markAsModified(tail.block);
        for (Index i = 0; i < mergeable.size(); i++) {
          tail.block->list.pop_back();
        }
        tail.block->list.push_back(builder.makeBreak(innerName));
        tail.block->finalize(tail.block->type);
      } else {
        markAsModified(tail.expr);
        *tail.pointer = builder.makeBreak(innerName);
      }
    }
    // make a block with the old body + the merged code
    auto* old = getFunction()->body;
    auto* inner = builder.makeBlock();
    inner->name = innerName;
    if (old->type == Type::unreachable) {
      // the old body is not flowed out of anyhow, so just put it there
      inner->list.push_back(old);
    } else {
      // otherwise, we must not flow out to the merged code
      if (old->type == Type::none) {
        inner->list.push_back(old);
        inner->list.push_back(builder.makeReturn());
      } else {
        // looks like we must return this. but if it's a toplevel block
        // then it might be marked as having a type, but not actually
        // returning it (we marked it as such for wasm type-checking
        // rules, and now it won't be toplevel in the function, it can
        // change)
        auto* toplevel = old->dynCast<Block>();
        if (toplevel) {
          toplevel->finalize();
        }
        if (old->type != Type::unreachable) {
          inner->list.push_back(builder.makeReturn(old));
        } else {
          inner->list.push_back(old);
        }
      }
    }
    inner->finalize();
    auto* outer = builder.makeBlock();
    outer->list.push_back(inner);
    while (!mergeable.empty()) {
      outer->list.push_back(mergeable.back());
      mergeable.pop_back();
    }
    // ensure the replacement has the same type, so the outside is not surprised
    outer->finalize(getFunction()->getResults());
    getFunction()->body = outer;
    return true;
  }